

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

int is_interinter_compound_used(COMPOUND_TYPE type,BLOCK_SIZE sb_type)

{
  BLOCK_SIZE in_SIL;
  byte in_DIL;
  int comp_allowed;
  bool local_11;
  uint local_4;
  
  local_4 = is_comp_ref_allowed(in_SIL);
  if (1 < in_DIL) {
    if (in_DIL == 2) {
      local_11 = false;
      if (local_4 != 0) {
        local_11 = 0 < av1_wedge_params_lookup[in_SIL].wedge_types;
      }
      local_4 = (uint)local_11;
    }
    else if (in_DIL != 3) {
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

static inline int is_interinter_compound_used(COMPOUND_TYPE type,
                                              BLOCK_SIZE sb_type) {
  const int comp_allowed = is_comp_ref_allowed(sb_type);
  switch (type) {
    case COMPOUND_AVERAGE:
    case COMPOUND_DISTWTD:
    case COMPOUND_DIFFWTD: return comp_allowed;
    case COMPOUND_WEDGE:
      return comp_allowed && av1_wedge_params_lookup[sb_type].wedge_types > 0;
    default: assert(0); return 0;
  }
}